

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cbtCollisionWorld.cpp
# Opt level: O2

void __thiscall
cbtCollisionWorld::convexSweepTest
          (cbtCollisionWorld *this,cbtConvexShape *castShape,cbtTransform *convexFromWorld,
          cbtTransform *convexToWorld,ConvexResultCallback *resultCallback,
          cbtScalar allowedCcdPenetration)

{
  undefined1 auVar1 [16];
  undefined1 auVar3 [56];
  undefined1 auVar2 [64];
  undefined8 in_XMM1_Qb;
  cbtQuaternion cVar4;
  CProfileSample __profile;
  cbtVector3 angVel;
  cbtVector3 castShapeAabbMax;
  cbtVector3 castShapeAabbMin;
  cbtVector3 linVel;
  cbtSingleSweepCallback convexCB;
  cbtTransform convexFromTrans;
  cbtTransform convexToTrans;
  CProfileSample local_1ed;
  cbtScalar local_1ec;
  cbtVector3 local_1e8;
  cbtVector3 local_1d0;
  cbtVector3 local_1c0;
  cbtVector3 local_1b0;
  cbtQuaternion local_1a0;
  cbtVector3 local_190;
  cbtSingleSweepCallback local_180;
  cbtTransform local_a8;
  cbtTransform local_68;
  
  local_1ec = allowedCcdPenetration;
  CProfileSample::CProfileSample(&local_1ed,"convexSweepTest");
  local_a8.m_basis.m_el[0].m_floats._0_8_ =
       *(undefined8 *)(convexFromWorld->m_basis).m_el[0].m_floats;
  local_a8.m_basis.m_el[0].m_floats._8_8_ =
       *(undefined8 *)((convexFromWorld->m_basis).m_el[0].m_floats + 2);
  local_a8.m_basis.m_el[1].m_floats._0_8_ =
       *(undefined8 *)(convexFromWorld->m_basis).m_el[1].m_floats;
  local_a8.m_basis.m_el[1].m_floats._8_8_ =
       *(undefined8 *)((convexFromWorld->m_basis).m_el[1].m_floats + 2);
  local_a8.m_basis.m_el[2].m_floats._0_8_ =
       *(undefined8 *)(convexFromWorld->m_basis).m_el[2].m_floats;
  local_a8.m_basis.m_el[2].m_floats._8_8_ =
       *(undefined8 *)((convexFromWorld->m_basis).m_el[2].m_floats + 2);
  local_a8.m_origin.m_floats._0_8_ = *(undefined8 *)(convexFromWorld->m_origin).m_floats;
  local_a8.m_origin.m_floats._8_8_ = *(undefined8 *)((convexFromWorld->m_origin).m_floats + 2);
  local_68.m_basis.m_el[0].m_floats._0_8_ = *(undefined8 *)(convexToWorld->m_basis).m_el[0].m_floats
  ;
  local_68.m_basis.m_el[0].m_floats._8_8_ =
       *(undefined8 *)((convexToWorld->m_basis).m_el[0].m_floats + 2);
  local_68.m_basis.m_el[1].m_floats._0_8_ = *(undefined8 *)(convexToWorld->m_basis).m_el[1].m_floats
  ;
  local_68.m_basis.m_el[1].m_floats._8_8_ =
       *(undefined8 *)((convexToWorld->m_basis).m_el[1].m_floats + 2);
  local_68.m_basis.m_el[2].m_floats._0_8_ = *(undefined8 *)(convexToWorld->m_basis).m_el[2].m_floats
  ;
  local_68.m_basis.m_el[2].m_floats._8_8_ =
       *(undefined8 *)((convexToWorld->m_basis).m_el[2].m_floats + 2);
  local_68.m_origin.m_floats._0_8_ = *(undefined8 *)(convexToWorld->m_origin).m_floats;
  local_68.m_origin.m_floats._8_8_ = *(undefined8 *)((convexToWorld->m_origin).m_floats + 2);
  cbtTransformUtil::calculateVelocity(&local_a8,&local_68,1.0,&local_190,&local_1d0);
  auVar3 = ZEXT856(0);
  local_180.super_cbtBroadphaseRayCallback.super_cbtBroadphaseAabbCallback.
  _vptr_cbtBroadphaseAabbCallback._0_4_ = 0x3f800000;
  local_180.super_cbtBroadphaseRayCallback._4_8_ = 0;
  local_180.super_cbtBroadphaseRayCallback.m_rayDirectionInverse.m_floats[1] = 0.0;
  local_180.super_cbtBroadphaseRayCallback.m_rayDirectionInverse.m_floats[2] = 0.0;
  local_180.super_cbtBroadphaseRayCallback.m_rayDirectionInverse.m_floats[3] = 1.0;
  local_180.super_cbtBroadphaseRayCallback.m_signs[0] = 0;
  local_180.super_cbtBroadphaseRayCallback.m_signs[1] = 0;
  local_180.super_cbtBroadphaseRayCallback.m_signs[2] = 0;
  local_180.super_cbtBroadphaseRayCallback.m_lambda_max = 0.0;
  local_180.m_convexFromTrans.m_basis.m_el[0].m_floats[0] = 1.0;
  local_180.m_convexFromTrans.m_basis.m_el[1].m_floats[1] = 0.0;
  local_1e8.m_floats[0] = 0.0;
  local_1e8.m_floats[1] = 0.0;
  local_1e8.m_floats[2] = 0.0;
  local_1e8.m_floats[3] = 0.0;
  local_180.m_convexFromTrans.m_basis.m_el[0].m_floats[1] = 0.0;
  local_180.m_convexFromTrans.m_basis.m_el[0].m_floats[2] = 0.0;
  local_180.m_convexFromTrans.m_basis.m_el[0].m_floats[3] = 0.0;
  local_180.m_convexFromTrans.m_basis.m_el[1].m_floats[0] = 0.0;
  cVar4 = cbtTransform::getRotation(&local_a8);
  auVar2._0_8_ = cVar4.super_cbtQuadWord.m_floats._0_8_;
  auVar2._8_56_ = auVar3;
  auVar1._8_8_ = in_XMM1_Qb;
  auVar1._0_8_ = cVar4.super_cbtQuadWord.m_floats._8_8_;
  local_1a0.super_cbtQuadWord.m_floats = (cbtQuadWord)vmovlhps_avx(auVar2._0_16_,auVar1);
  cbtMatrix3x3::setRotation((cbtMatrix3x3 *)&local_180,&local_1a0);
  cbtCollisionShape::calculateTemporalAabb
            (&castShape->super_cbtCollisionShape,(cbtTransform *)&local_180,&local_1e8,&local_1d0,
             1.0,&local_1b0,&local_1c0);
  cbtSingleSweepCallback::cbtSingleSweepCallback
            (&local_180,castShape,convexFromWorld,convexToWorld,this,resultCallback,local_1ec);
  (*this->m_broadphasePairCache->_vptr_cbtBroadphaseInterface[6])
            (this->m_broadphasePairCache,&local_a8.m_origin,&local_68.m_origin,&local_180,&local_1b0
             ,&local_1c0);
  CProfileSample::~CProfileSample(&local_1ed);
  return;
}

Assistant:

void cbtCollisionWorld::convexSweepTest(const cbtConvexShape* castShape, const cbtTransform& convexFromWorld, const cbtTransform& convexToWorld, ConvexResultCallback& resultCallback, cbtScalar allowedCcdPenetration) const
{
	BT_PROFILE("convexSweepTest");
	/// use the broadphase to accelerate the search for objects, based on their aabb
	/// and for each object with ray-aabb overlap, perform an exact ray test
	/// unfortunately the implementation for rayTest and convexSweepTest duplicated, albeit practically identical

	cbtTransform convexFromTrans, convexToTrans;
	convexFromTrans = convexFromWorld;
	convexToTrans = convexToWorld;
	cbtVector3 castShapeAabbMin, castShapeAabbMax;
	/* Compute AABB that encompasses angular movement */
	{
		cbtVector3 linVel, angVel;
		cbtTransformUtil::calculateVelocity(convexFromTrans, convexToTrans, 1.0f, linVel, angVel);
		cbtVector3 zeroLinVel;
		zeroLinVel.setValue(0, 0, 0);
		cbtTransform R;
		R.setIdentity();
		R.setRotation(convexFromTrans.getRotation());
		castShape->calculateTemporalAabb(R, zeroLinVel, angVel, 1.0f, castShapeAabbMin, castShapeAabbMax);
	}

#ifndef USE_BRUTEFORCE_RAYBROADPHASE

	cbtSingleSweepCallback convexCB(castShape, convexFromWorld, convexToWorld, this, resultCallback, allowedCcdPenetration);

	m_broadphasePairCache->rayTest(convexFromTrans.getOrigin(), convexToTrans.getOrigin(), convexCB, castShapeAabbMin, castShapeAabbMax);

#else
	/// go over all objects, and if the ray intersects their aabb + cast shape aabb,
	// do a ray-shape query using convexCaster (CCD)
	int i;
	for (i = 0; i < m_collisionObjects.size(); i++)
	{
		cbtCollisionObject* collisionObject = m_collisionObjects[i];
		//only perform raycast if filterMask matches
		if (resultCallback.needsCollision(collisionObject->getBroadphaseHandle()))
		{
			//RigidcollisionObject* collisionObject = ctrl->GetRigidcollisionObject();
			cbtVector3 collisionObjectAabbMin, collisionObjectAabbMax;
			collisionObject->getCollisionShape()->getAabb(collisionObject->getWorldTransform(), collisionObjectAabbMin, collisionObjectAabbMax);
			AabbExpand(collisionObjectAabbMin, collisionObjectAabbMax, castShapeAabbMin, castShapeAabbMax);
			cbtScalar hitLambda = cbtScalar(1.);  //could use resultCallback.m_closestHitFraction, but needs testing
			cbtVector3 hitNormal;
			if (cbtRayAabb(convexFromWorld.getOrigin(), convexToWorld.getOrigin(), collisionObjectAabbMin, collisionObjectAabbMax, hitLambda, hitNormal))
			{
				objectQuerySingle(castShape, convexFromTrans, convexToTrans,
								  collisionObject,
								  collisionObject->getCollisionShape(),
								  collisionObject->getWorldTransform(),
								  resultCallback,
								  allowedCcdPenetration);
			}
		}
	}
#endif  //USE_BRUTEFORCE_RAYBROADPHASE
}